

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeLodControlTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeLodControlTestInstance *this)

{
  ostringstream *this_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TestLog *pTVar5;
  TextureCubeLodControlTestInstance *pTVar6;
  int iVar7;
  deUint32 dVar8;
  deUint32 height;
  uint uVar9;
  undefined4 extraout_var;
  TextureBinding *this_01;
  undefined4 extraout_var_00;
  pointer __n;
  Surface *pSVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  TextureRenderer *pTVar12;
  long lVar13;
  ulong uVar14;
  allocator<char> local_4ef;
  allocator<char> local_4ee;
  allocator<char> local_4ed;
  deUint32 local_4ec;
  TextureRenderer *local_4e8;
  TextureCubeLodControlTestInstance *local_4e0;
  TestStatus *local_4d8;
  ulong local_4d0;
  PixelFormat local_4c8;
  vector<float,_std::allocator<float>_> texCoord;
  LodPrecision lodPrec;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  ConstPixelBufferAccess local_470;
  PixelBufferAccess local_448;
  PixelBufferAccess local_420;
  PixelBufferAccess local_3f8;
  Surface referenceFrame;
  Surface renderedFrame;
  Surface errorMask;
  TextureFormat local_388;
  WrapMode local_380;
  int local_37c [3];
  TextureFormat local_370;
  ConstPixelBufferAccess *pCStack_368;
  BVec4 local_360;
  IVec4 formatBitDepth;
  undefined1 local_33c [76];
  ConstPixelBufferAccess *pCStack_2f0;
  ConstPixelBufferAccess *local_2e8;
  ConstPixelBufferAccess *pCStack_2e0;
  int local_2d8;
  bool local_2c4;
  undefined7 uStack_2c3;
  LodMode local_2bc;
  deUint32 local_2b0;
  deUint32 local_2ac;
  SurfaceAccess idealDst;
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  int local_1f8;
  undefined1 auStack_1f4 [348];
  PixelBufferAccess local_98;
  Sampler sampler;
  long lVar10;
  
  local_4d8 = __return_storage_ptr__;
  iVar7 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
  lVar10 = CONCAT44(extraout_var,iVar7);
  pTVar12 = &this->m_renderer;
  dVar8 = util::TextureRenderer::getRenderWidth(pTVar12);
  local_4e8 = pTVar12;
  height = util::TextureRenderer::getRenderHeight(pTVar12);
  util::createSampler(&sampler,CLAMP_TO_EDGE,CLAMP_TO_EDGE,this->m_minFilter,NEAREST);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_33c,TEXTURETYPE_CUBE,&sampler,LODMODE_EXACT);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,dVar8,height);
  uVar1 = this->m_texSize;
  if (uVar1 == 0) {
    uVar9 = 0x20;
  }
  else {
    uVar9 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = uVar9 ^ 0x1f;
  }
  local_2ac = 0x1f - uVar9;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d0 = CONCAT44(local_4d0._4_4_,dVar8);
  local_4ec = height;
  local_4e0 = this;
  computeGridLayout(&gridLayout,dVar8,height);
  lVar13 = 0xc;
  uVar14 = 0;
  while( true ) {
    if ((long)(int)((ulong)((long)gridLayout.
                                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)gridLayout.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (long)uVar14)
    break;
    iVar7 = *(int *)((long)(gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + -0xc);
    iVar2 = *(int *)((long)(gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + -8);
    iVar3 = *(int *)((long)(gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + -4);
    iVar4 = *(int *)((long)(gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13);
    glu::TextureTestUtil::computeQuadTexCoordCube
              (&texCoord,(int)((uVar14 & 0xffffffff) / 6) * -6 + (int)uVar14);
    (*(local_4e0->super_TestInstance)._vptr_TestInstance[3])
              (local_4e0,local_33c,uVar14 & 0xffffffff);
    util::TextureRenderer::setViewport
              (local_4e8,(float)iVar7,(float)iVar2,(float)iVar3,(float)iVar4);
    this_01 = util::TextureRenderer::getTextureBinding(local_4e8,0);
    util::TextureBinding::updateTextureViewMipLevels(this_01,local_2b0,local_2ac);
    util::TextureRenderer::renderQuad
              (local_4e8,&renderedFrame,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_33c);
    uVar14 = uVar14 + 1;
    lVar13 = lVar13 + 0x10;
  }
  local_218._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  pTVar6 = local_4e0;
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)local_218);
  dVar8 = local_4ec;
  local_4c8.redBits = formatBitDepth.m_data[0];
  local_4c8.greenBits = formatBitDepth.m_data[1];
  local_4c8.blueBits = formatBitDepth.m_data[2];
  local_4c8.alphaBits = formatBitDepth.m_data[3];
  iVar7 = (int)local_4d0;
  tcu::Surface::Surface(&referenceFrame,(int)local_4d0,local_4ec);
  tcu::Surface::Surface(&errorMask,iVar7,dVar8);
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)&local_388);
  lodPrec.rule = RULE_VULKAN;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  util::createSampler((Sampler *)local_218,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (pTVar6->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,NEAREST);
  local_2d8 = local_1f8;
  local_2e8 = (ConstPixelBufferAccess *)local_208._M_allocated_capacity;
  pCStack_2e0 = (ConstPixelBufferAccess *)local_208._8_8_;
  local_33c._68_8_ = local_218._0_8_;
  pCStack_2f0 = (ConstPixelBufferAccess *)local_218._8_8_;
  uStack_2c3 = (undefined7)(CONCAT44(auStack_1f4._20_4_,auStack_1f4._16_4_) >> 8);
  local_2c4 = true;
  local_2bc = LODMODE_EXACT;
  local_360.m_data[1] = 0 < local_4c8.greenBits;
  local_360.m_data[0] = 0 < local_4c8.redBits;
  local_360.m_data[2] = 0 < local_4c8.blueBits;
  local_360.m_data[3] = 0 < local_4c8.alphaBits;
  local_470.m_format.order = local_4c8.redBits;
  local_470.m_format.type = local_4c8.greenBits;
  local_470.m_size.m_data[0] = local_4c8.blueBits;
  local_470.m_size.m_data[1] = local_4c8.alphaBits;
  tcu::operator-((tcu *)&local_448,(Vector<int,_4> *)&local_470,2);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_3f8,0);
  tcu::max<int,4>((tcu *)&idealDst,(Vector<int,_4> *)&local_448,(Vector<int,_4> *)&local_3f8);
  tcu::computeFixedPointThreshold((tcu *)local_218,(IVec4 *)&idealDst);
  local_370.order = local_218._0_4_;
  local_370.type = local_218._4_4_;
  pCStack_368 = (ConstPixelBufferAccess *)local_218._8_8_;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_218,10);
  local_380 = local_218._8_4_;
  local_388.order = local_218._0_4_;
  local_388.type = local_218._4_4_;
  local_37c[0] = 5;
  local_37c[1] = 5;
  local_37c[2] = 0;
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = 6;
  uVar14 = 0;
  pTVar12 = (TextureRenderer *)0xc;
  local_4ec = 0;
  while( true ) {
    pTVar6 = local_4e0;
    dVar8 = local_4ec;
    if ((long)(int)((ulong)((long)gridLayout.
                                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)gridLayout.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (long)uVar14)
    break;
    iVar7 = *(int *)((long)(gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_data + 1) +
                    (long)pTVar12);
    iVar2 = *(int *)((long)(gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_data + 2) +
                    (long)pTVar12);
    iVar3 = *(int *)((long)(gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_data + 3) +
                    (long)pTVar12);
    iVar4 = *(int *)((long)&pTVar12->m_context +
                    (long)(gridLayout.
                           super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data);
    local_4e8 = pTVar12;
    glu::TextureTestUtil::computeQuadTexCoordCube
              (&texCoord,(int)((uVar14 & 0xffffffff) / 6) * -6 + (int)uVar14);
    (*(local_4e0->super_TestInstance)._vptr_TestInstance[3])
              (local_4e0,local_33c,uVar14 & 0xffffffff);
    local_4d0 = uVar14;
    tcu::SurfaceAccess::SurfaceAccess(&idealDst,&referenceFrame,&local_4c8,iVar7,iVar2,iVar3,iVar4);
    auStack_1f4._12_4_ = (undefined4)*(undefined8 *)(lVar10 + 0x160);
    auStack_1f4._16_4_ = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x160) >> 0x20);
    local_218._0_8_ = *(TextureFormat *)(lVar10 + 0x130);
    local_218._8_8_ = *(undefined8 *)(lVar10 + 0x138);
    local_208._M_allocated_capacity = *(undefined8 *)(lVar10 + 0x140);
    local_208._8_8_ = *(undefined8 *)(lVar10 + 0x148);
    local_1f8 = (int)*(undefined8 *)(lVar10 + 0x150);
    auStack_1f4._0_4_ = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x150) >> 0x20);
    auStack_1f4._4_4_ = (undefined4)*(undefined8 *)(lVar10 + 0x158);
    auStack_1f4._8_4_ = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x158) >> 0x20);
    glu::TextureTestUtil::sampleTexture
              (&idealDst,(TextureCubeView *)local_218,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_33c);
    tcu::Surface::getAccess(&local_448,&renderedFrame);
    tcu::getSubregion((PixelBufferAccess *)&idealDst,&local_448,iVar7,iVar2,iVar3,iVar4);
    tcu::Surface::getAccess(&local_3f8,&referenceFrame);
    tcu::getSubregion((PixelBufferAccess *)&local_470,&local_3f8,iVar7,iVar2,iVar3,iVar4);
    tcu::Surface::getAccess(&local_98,&errorMask);
    tcu::getSubregion(&local_420,&local_98,iVar7,iVar2,iVar3,iVar4);
    pTVar6 = local_4e0;
    iVar7 = (*(((local_4e0->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
    lVar13 = CONCAT44(extraout_var_00,iVar7);
    auStack_1f4._12_4_ = (undefined4)*(undefined8 *)(lVar13 + 0x160);
    auStack_1f4._16_4_ = (undefined4)((ulong)*(undefined8 *)(lVar13 + 0x160) >> 0x20);
    local_218._0_8_ = *(TextureFormat *)(lVar13 + 0x130);
    local_218._8_8_ = *(undefined8 *)(lVar13 + 0x138);
    local_208._M_allocated_capacity = *(undefined8 *)(lVar13 + 0x140);
    local_208._8_8_ = *(undefined8 *)(lVar13 + 0x148);
    local_1f8 = (int)*(undefined8 *)(lVar13 + 0x150);
    auStack_1f4._0_4_ = (undefined4)((ulong)*(undefined8 *)(lVar13 + 0x150) >> 0x20);
    auStack_1f4._4_4_ = (undefined4)*(undefined8 *)(lVar13 + 0x158);
    auStack_1f4._8_4_ = (undefined4)((ulong)*(undefined8 *)(lVar13 + 0x158) >> 0x20);
    iVar7 = glu::TextureTestUtil::computeTextureLookupDiff
                      ((ConstPixelBufferAccess *)&idealDst,&local_470,&local_420,
                       (TextureCubeView *)local_218,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)local_33c,
                       (LookupPrecision *)&local_388,&lodPrec,
                       ((pTVar6->super_TestInstance).m_context)->m_testCtx->m_watchDog);
    local_4ec = local_4ec + iVar7;
    uVar14 = local_4d0 + 1;
    pTVar12 = (TextureRenderer *)&local_4e8->m_renderWidth;
  }
  __n = gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)local_4ec) {
    local_218._0_8_ = ((local_4e0->super_TestInstance).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_218 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"ERROR: Image verification failed, found ");
    std::ostream::operator<<(this_00,dVar8);
    std::operator<<((ostream *)this_00," invalid pixels!");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_218,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  pTVar5 = ((pTVar6->super_TestInstance).m_context)->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"Result",(allocator<char> *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"Verification result",&local_4ed);
  tcu::LogImageSet::LogImageSet((LogImageSet *)&idealDst,(string *)&local_448,(string *)&local_470);
  iVar7 = (int)pTVar5;
  tcu::LogImageSet::write((LogImageSet *)&idealDst,iVar7,__buf,(size_t)__n);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"Rendered",&local_4ee);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"Rendered image",&local_4ef);
  pSVar11 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)local_218,(string *)&local_3f8,(string *)&local_420,pSVar11,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_218,iVar7,__buf_00,(size_t)pSVar11);
  tcu::LogImage::~LogImage((LogImage *)local_218);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_3f8);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)&idealDst);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_448);
  if (0 < (int)dVar8) {
    pTVar5 = ((pTVar6->super_TestInstance).m_context)->m_testCtx->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,"Reference",(allocator<char> *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"Ideal reference",&local_4ed);
    pSVar11 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)local_218,(string *)&local_448,(string *)&local_470,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar7 = (int)pTVar5;
    tcu::LogImage::write((LogImage *)local_218,iVar7,__buf_01,(size_t)pSVar11);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"ErrorMask",&local_4ee);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"Error mask",&local_4ef)
    ;
    pSVar11 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&idealDst,(string *)&local_3f8,(string *)&local_420,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&idealDst,iVar7,__buf_02,(size_t)pSVar11);
    tcu::LogImage::~LogImage((LogImage *)&idealDst);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_3f8);
    tcu::LogImage::~LogImage((LogImage *)local_218);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::~string((string *)&local_448);
  }
  tcu::TestLog::endImageSet(((pTVar6->super_TestInstance).m_context)->m_testCtx->m_log);
  if (dVar8 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_218,"pass",(allocator<char> *)&idealDst);
    tcu::TestStatus::pass(local_4d8,(string *)local_218);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_218,"fail",(allocator<char> *)&idealDst);
    tcu::TestStatus::fail(local_4d8,(string *)local_218);
  }
  std::__cxx11::string::~string((string *)local_218);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
            (&gridLayout.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>);
  tcu::Surface::~Surface(&renderedFrame);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  return local_4d8;
}

Assistant:

tcu::TestStatus TextureCubeLodControlTestInstance::iterate (void)
{
	const tcu::Sampler::WrapMode	wrapS			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::WrapMode	wrapT			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::FilterMode	magFilter		= Sampler::NEAREST;

	const tcu::TextureCube&			refTexture		= m_texture->getTexture();
	const int						viewportWidth	= m_renderer.getRenderWidth();
	const int						viewportHeight	= m_renderer.getRenderHeight();

	tcu::Sampler					sampler			= util::createSampler(wrapS, wrapT, m_minFilter, magFilter);
	ReferenceParams					refParams		(TEXTURETYPE_CUBE, sampler);
	vector<float>					texCoord;
	tcu::Surface					renderedFrame	(viewportWidth, viewportHeight);

	refParams.maxLevel = deLog2Floor32(m_texSize);

	// Compute grid.
	vector<tcu::IVec4> gridLayout;
	computeGridLayout(gridLayout, viewportWidth, viewportHeight);

	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		const int			curX		= gridLayout[cellNdx].x();
		const int			curY		= gridLayout[cellNdx].y();
		const int			curW		= gridLayout[cellNdx].z();
		const int			curH		= gridLayout[cellNdx].w();
		const tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

		computeQuadTexCoordCube(texCoord, cubeFace);
		getReferenceParams(refParams, cellNdx);

		// Render with GL.
		m_renderer.setViewport((float)curX, (float)curY, (float)curW, (float)curH);
		m_renderer.getTextureBinding(0)->updateTextureViewMipLevels(refParams.baseLevel, refParams.maxLevel);
		m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
	}

	// Render reference and compare
	{
		const tcu::IVec4		formatBitDepth		= getTextureFormatBitDepth(mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat			(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		tcu::Surface			referenceFrame		(viewportWidth, viewportHeight);
		tcu::Surface			errorMask			(viewportWidth, viewportHeight);
		int						numFailedPixels		= 0;
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec				(tcu::LodPrecision::RULE_VULKAN);

		// Params for rendering reference
		refParams.sampler					= util::createSampler(wrapS, wrapT, m_testParameters.minFilter, magFilter);
		refParams.sampler.seamlessCubeMap	= true;
		refParams.lodMode					= LODMODE_EXACT;

		// Comparison parameters
		lookupPrec.colorMask				= getCompareMask(pixelFormat);
		lookupPrec.colorThreshold			= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat)-2, IVec4(0)));
		lookupPrec.coordBits				= tcu::IVec3(10);
		lookupPrec.uvwBits					= tcu::IVec3(5,5,0);
		lodPrec.derivateBits				= 10;
		lodPrec.lodBits						= 6;

		for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
		{
			const int				curX		= gridLayout[cellNdx].x();
			const int				curY		= gridLayout[cellNdx].y();
			const int				curW		= gridLayout[cellNdx].z();
			const int				curH		= gridLayout[cellNdx].w();
			const tcu::CubeFace		cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

			computeQuadTexCoordCube(texCoord, cubeFace);
			getReferenceParams(refParams, cellNdx);

			// Render ideal reference.
			{
				tcu::SurfaceAccess idealDst(referenceFrame, pixelFormat, curX, curY, curW, curH);
				sampleTexture(idealDst, refTexture, &texCoord[0], refParams);
			}

			// Compare this cell
			numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
														m_texture->getTexture(), &texCoord[0], refParams,
														lookupPrec, lodPrec,  m_context.getTestContext().getWatchDog());
		}

		if (numFailedPixels > 0)
			 m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		 m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											 << TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			 m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												 << TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		 m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}